

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

void ecc_edwards_normalise(EdwardsPoint *ep)

{
  EdwardsCurve *pEVar1;
  mp_int *y;
  mp_int *zinv;
  EdwardsCurve *ec;
  EdwardsPoint *ep_local;
  
  pEVar1 = ep->ec;
  y = monty_invert(pEVar1->mc,ep->Z);
  monty_mul_into(pEVar1->mc,ep->X,ep->X,y);
  monty_mul_into(pEVar1->mc,ep->Y,ep->Y,y);
  monty_mul_into(pEVar1->mc,ep->Z,ep->Z,y);
  mp_free(y);
  monty_mul_into(pEVar1->mc,ep->T,ep->X,ep->Y);
  return;
}

Assistant:

static void ecc_edwards_normalise(EdwardsPoint *ep)
{
    EdwardsCurve *ec = ep->ec;
    mp_int *zinv = monty_invert(ec->mc, ep->Z);
    monty_mul_into(ec->mc, ep->X, ep->X, zinv);
    monty_mul_into(ec->mc, ep->Y, ep->Y, zinv);
    monty_mul_into(ec->mc, ep->Z, ep->Z, zinv);
    mp_free(zinv);
    monty_mul_into(ec->mc, ep->T, ep->X, ep->Y);
}